

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

_Bool CheckCollisionPointPoly(Vector2 point,Vector2 *points,int pointCount)

{
  float fVar1;
  _Bool _Var2;
  ulong uVar3;
  int iVar4;
  float fVar5;
  
  fVar5 = point.y;
  if (pointCount < 3) {
    _Var2 = false;
  }
  else {
    iVar4 = pointCount + -1;
    uVar3 = 0;
    _Var2 = false;
    do {
      fVar1 = points[uVar3].y;
      if ((points[iVar4].y <= fVar5 == fVar5 < fVar1) &&
         (point.x < ((fVar5 - fVar1) * (points[iVar4].x - points[uVar3].x)) /
                    (points[iVar4].y - fVar1) + points[uVar3].x)) {
        _Var2 = (_Bool)(_Var2 ^ 1);
      }
      iVar4 = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while ((uint)pointCount != uVar3);
  }
  return _Var2;
}

Assistant:

bool CheckCollisionPointPoly(Vector2 point, const Vector2 *points, int pointCount)
{
    bool inside = false;

    if (pointCount > 2)
    {
        for (int i = 0, j = pointCount - 1; i < pointCount; j = i++)
        {
            if ((points[i].y > point.y) != (points[j].y > point.y) &&
                (point.x < (points[j].x - points[i].x)*(point.y - points[i].y)/(points[j].y - points[i].y) + points[i].x))
            {
                inside = !inside;
            }
        }
    }

    return inside;
}